

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.c
# Opt level: O2

ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *state,ZydisDecodedInstruction *instruction)

{
  byte *pbVar1;
  ZyanU8 *pZVar2;
  ZyanU8 ZVar3;
  ZyanU8 ZVar4;
  ZydisMachineMode ZVar5;
  ZydisInstructionEncoding ZVar6;
  ZydisDecoderContext *pZVar7;
  bool bVar8;
  uint3 uVar9;
  ulong *puVar10;
  undefined8 *puVar11;
  int iVar12;
  ZyanU8 ZVar13;
  ZyanBool ZVar14;
  ushort uVar15;
  short sVar16;
  ZyanU16 ZVar17;
  ZyanStatus status_047620348;
  ZydisOpcodeMap ZVar18;
  ZyanStatus ZVar19;
  ZydisInstructionCategory ZVar20;
  ZydisDecoderTreeNode *node;
  ZydisDecoderTreeNode *pZVar21;
  ZydisDecoderTreeNode *pZVar22;
  ulong uVar23;
  sbyte sVar24;
  byte bVar25;
  byte bVar26;
  char cVar27;
  ZydisMaskMode ZVar28;
  ZyanU8 *pZVar29;
  byte bVar30;
  ZydisBranchType ZVar31;
  ZydisMaskMode ZVar32;
  undefined1 *puVar33;
  undefined2 *puVar34;
  ZyanU8 *pZVar35;
  byte bVar36;
  uint uVar37;
  uint uVar38;
  uint uVar39;
  ulong uVar40;
  undefined3 *puVar41;
  byte bVar42;
  byte bVar43;
  ulong uVar44;
  long lVar45;
  byte bVar46;
  char cVar47;
  char cVar48;
  byte bVar49;
  byte bVar50;
  byte bVar51;
  byte bVar52;
  ZydisBroadcastMode ZVar53;
  bool bVar54;
  ZyanU16 index;
  ZydisDecoderState *local_c8;
  bool local_ba;
  byte local_b9;
  ZydisDecoderContext *local_b8;
  ZyanU8 prefix_bytes [4];
  undefined4 uStack_ac;
  ZyanU8 modrm_byte_2;
  undefined7 uStack_57;
  undefined4 local_4c;
  ulong local_48;
  ZydisInstructionDefinitionLEGACY *def;
  ZydisInstructionEncodingInfo *info;
  
  if (state == (ZydisDecoderState *)0x0) {
    __assert_fail("state",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1248,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  pZVar35 = &instruction->opcode;
  pZVar2 = &(instruction->raw).field_3.rex.offset;
  ZVar53 = ZYDIS_BROADCAST_MODE_4_TO_8;
  pZVar22 = (ZydisDecoderTreeNode *)0x0;
  node = &zydis_decoder_tree_root;
  local_c8 = state;
LAB_0010f7cb:
  do {
    pZVar21 = pZVar22;
    index = 0;
    switch(node->type) {
    case '\0':
      if (pZVar21 == (ZydisDecoderTreeNode *)0x0) {
        return 0x80200001;
      }
      ZVar13 = (local_c8->prefixes).mandatory_candidate;
      if (ZVar13 != '\0') {
        bVar42 = (local_c8->prefixes).offset_mandatory;
        (instruction->raw).prefixes[bVar42].type = ZYDIS_PREFIX_TYPE_IGNORED;
        if (ZVar13 == 'f') {
          if ((local_c8->prefixes).offset_osz_override == bVar42) {
            (instruction->raw).prefixes[bVar42].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
          }
          instruction->attributes = instruction->attributes | 0x80000000000;
        }
      }
      pZVar22 = (ZydisDecoderTreeNode *)0x0;
      node = pZVar21;
      goto LAB_0010f7cb;
    case '\x01':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
LAB_0010fb02:
        ZVar17 = 0;
      }
      else {
        if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_XOP) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xde4,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xde0,
                        "ZyanStatus ZydisNodeHandlerXOP(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        bVar42 = (instruction->raw).field_3.xop.pp;
        ZVar17 = ((ushort)(instruction->raw).field_3.rex.B + (ushort)bVar42 + (ushort)bVar42 * 2) -
                 7;
      }
      break;
    case '\x02':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_0010fb02;
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdf8,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      if ((instruction->attributes & 0x10) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 4)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xdf4,
                      "ZyanStatus ZydisNodeHandlerVEX(const ZydisDecodedInstruction *, ZyanU16 *)");
      }
      ZVar17 = (ushort)(instruction->raw).field_3.rex.B +
               (ushort)(instruction->raw).field_3.xop.pp * 4 + 1;
      break;
    case '\x03':
      ZVar6 = instruction->encoding;
      if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_LEGACY) goto LAB_0010fb02;
      if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe0c,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar16 = 0x21;
        sVar24 = 2;
      }
      else {
        if (ZVar6 != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe10,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xe08,
                        "ZyanStatus ZydisNodeHandlerEMVEX(const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        sVar16 = 1;
        sVar24 = 3;
      }
      ZVar17 = sVar16 + (ushort)(instruction->raw).field_3.rex.offset +
               ((ushort)(instruction->raw).field_3.xop.pp << sVar24);
      break;
    case '\x04':
      if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
        index = 0xc;
        ZVar17 = index;
      }
      else {
        if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
          ZVar19 = ZydisInputNext(local_c8,instruction,pZVar35);
          if ((int)ZVar19 < 0) {
            return ZVar19;
          }
          goto LAB_0010fd81;
        }
        ZVar19 = ZydisInputNext(local_c8,instruction,pZVar35);
        if ((int)ZVar19 < 0) {
          return ZVar19;
        }
        ZVar18 = instruction->opcode_map;
        if (ZYDIS_OPCODE_MAP_MAX_VALUE < ZVar18) {
LAB_00112519:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xed5,
                        "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xe0cU >> (ZVar18 & 0x1f) & 1) == 0) {
          if (ZVar18 == ZYDIS_OPCODE_MAP_DEFAULT) {
            bVar42 = *pZVar35;
            if (bVar42 - 0xc4 < 2) {
LAB_0010fede:
              bVar25 = instruction->length;
              if (0xe < bVar25) {
                return 0x80200002;
              }
              if (local_c8->buffer_len == 0) {
                return 0x80200000;
              }
              if ((*local_c8->buffer < 0xc0) &&
                 (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) goto LAB_0010fd81;
              uVar23 = instruction->attributes;
              if ((uVar23 & 4) != 0) {
                return 0x80200006;
              }
              if ((local_c8->prefixes).has_lock != '\0') {
                return 0x80200004;
              }
              if ((local_c8->prefixes).mandatory_candidate != '\0') {
                return 0x80200005;
              }
              prefix_bytes[1] = '\0';
              prefix_bytes[2] = '\0';
              prefix_bytes[3] = '\0';
              prefix_bytes[0] = bVar42;
              if (bVar42 == 0x62) {
                if ((uVar23 & 0x20) != 0) {
                  __assert_fail("!(instruction->attributes & (1ULL << 5))",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0xe51,
                                "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                               );
                }
                if ((uVar23 & 0x40) != 0) {
                  __assert_fail("!(instruction->attributes & (1ULL << 6))",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0xe52,
                                "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                               );
                }
                ZVar13 = '\x03';
LAB_0011015a:
                ZVar19 = ZydisInputNextBytes(local_c8,instruction,prefix_bytes + 1,ZVar13);
              }
              else {
                if (bVar42 != 0xc5) {
                  if (bVar42 != 0xc4) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0xe59,
                                  "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                 );
                  }
                  (instruction->raw).field_3.xop.offset = bVar25 - 1;
                  if ((uVar23 & 0x10) != 0) {
                    __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0xe45,
                                  "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                                 );
                  }
                  ZVar13 = '\x02';
                  goto LAB_0011015a;
                }
                (instruction->raw).field_3.xop.offset = bVar25 - 1;
                if ((uVar23 & 0x10) != 0) {
                  __assert_fail("!(instruction->attributes & (1ULL << 4))",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0xe4b,
                                "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                               );
                }
                ZVar19 = ZydisInputNext(local_c8,instruction,prefix_bytes + 1);
              }
              if ((int)ZVar19 < 0) {
                return ZVar19;
              }
              if (*pZVar35 - 0xc4 < 2) {
                instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS;
                if ((prefix_bytes[0] & 0xfe) != 0xc4) {
                  __assert_fail("(data[0] == 0xC4) || (data[0] == 0xC5)",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x1ca,
                                "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE) {
                  return 0x80200001;
                }
                pZVar7 = local_c8->context;
                *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x10;
                uVar37 = (uint)(instruction->raw).field_3.xop.offset;
                if (prefix_bytes[0] == 0xc4) {
                  if (instruction->length - 3 != uVar37) {
                    __assert_fail("instruction->raw.vex.offset == instruction->length - 3",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0x1d6,
                                  "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  (instruction->raw).field_3.vex.size = '\x03';
                  (instruction->raw).field_3.rex.W = prefix_bytes[1] >> 7;
                  (instruction->raw).field_3.rex.R = prefix_bytes[1] >> 6 & 1;
                  (instruction->raw).field_3.rex.X = prefix_bytes[1] >> 5 & 1;
                  (instruction->raw).field_3.rex.B = prefix_bytes[1] & 0x1f;
                  bVar42 = prefix_bytes[2] >> 7;
                  (instruction->raw).field_3.rex.offset = bVar42;
                  (instruction->raw).field_3.xop.vvvv = prefix_bytes[2] >> 3 & 0xf;
                  (instruction->raw).field_3.xop.L = prefix_bytes[2] >> 2 & 1;
                  (instruction->raw).field_3.xop.pp = prefix_bytes[2] & 3;
                  if (3 < (prefix_bytes[1] & 0x1f)) {
                    return 0x80200007;
                  }
                }
                else {
                  if (instruction->length - 2 != uVar37) {
                    __assert_fail("instruction->raw.vex.offset == instruction->length - 2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0x1e2,
                                  "ZyanStatus ZydisDecodeVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  (instruction->raw).field_3.vex.size = '\x02';
                  (instruction->raw).field_3.rex.W = prefix_bytes[1] >> 7;
                  *(undefined4 *)((long)&(instruction->raw).field_3 + 1) = 0x10101;
                  (instruction->raw).field_3.xop.vvvv = prefix_bytes[1] >> 3 & 0xf;
                  (instruction->raw).field_3.xop.L = prefix_bytes[1] >> 2 & 1;
                  (instruction->raw).field_3.xop.pp = prefix_bytes[1] & 3;
                  bVar42 = 0;
                }
                (pZVar7->vector_unified).W = bVar42;
                (pZVar7->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
                (pZVar7->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
                (pZVar7->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
                ZVar13 = (instruction->raw).field_3.xop.L;
                (pZVar7->vector_unified).L = ZVar13;
                (pZVar7->vector_unified).LL = ZVar13;
                (pZVar7->vector_unified).vvvv = ~(instruction->raw).field_3.xop.vvvv & 0xf;
                pZVar29 = &(instruction->raw).field_3.rex.B;
              }
              else {
                if (*pZVar35 != 0x62) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0xe91,
                                "ZyanStatus ZydisNodeHandlerOpcode(ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                               );
                }
                bVar42 = instruction->length;
                bVar25 = bVar42 - 4;
                pZVar29 = pZVar2;
                if ((prefix_bytes[2] & 4) == 0) {
                  (instruction->raw).field_3.evex.V2 = bVar25;
                  if (local_c8->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                    return 0x80200001;
                  }
                  instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE;
                  if (prefix_bytes[0] != 'b') {
                    __assert_fail("data[0] == 0x62",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0x275,
                                  "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  if (bVar42 - 4 != (uint)bVar25) {
                    __assert_fail("instruction->raw.mvex.offset == instruction->length - 4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0x276,
                                  "ZyanStatus ZydisDecodeMVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  if (instruction->machine_mode != ZYDIS_MACHINE_MODE_LONG_64) {
                    return 0x80200001;
                  }
                  pZVar7 = local_c8->context;
                  *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x40;
                  (instruction->raw).field_3.rex.W = prefix_bytes[1] >> 7;
                  (instruction->raw).field_3.rex.R = prefix_bytes[1] >> 6 & 1;
                  (instruction->raw).field_3.rex.X = prefix_bytes[1] >> 5 & 1;
                  (instruction->raw).field_3.rex.B = prefix_bytes[1] >> 4 & 1;
                  (instruction->raw).field_3.rex.offset = prefix_bytes[1] & 0xf;
                  if (3 < (prefix_bytes[1] & 0xf)) {
                    return 0x80200007;
                  }
                  (instruction->raw).field_3.xop.vvvv = prefix_bytes[2] >> 7;
                  (instruction->raw).field_3.xop.L = prefix_bytes[2] >> 3 & 0xf;
                  (instruction->raw).field_3.xop.pp = prefix_bytes[2] & 3;
                  (instruction->raw).field_3.xop.offset = prefix_bytes[3] >> 7;
                  (instruction->raw).field_3.vex.size = prefix_bytes[3] >> 4 & 7;
                  (instruction->raw).field_3.evex.L = prefix_bytes[3] >> 3 & 1;
                  (instruction->raw).field_3.evex.b = prefix_bytes[3] & 7;
                  (pZVar7->vector_unified).W = prefix_bytes[2] >> 7;
                  (pZVar7->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
                  (pZVar7->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
                  (pZVar7->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
                  (pZVar7->vector_unified).R2 = ~(instruction->raw).field_3.rex.B & 1;
                  (pZVar7->vector_unified).V2 = ~(instruction->raw).field_3.evex.L & 1;
                  (pZVar7->vector_unified).LL = '\x02';
                  (pZVar7->vector_unified).vvvv = ~(instruction->raw).field_3.xop.L & 0xf;
                  (pZVar7->vector_unified).mask = (instruction->raw).field_3.evex.b;
                }
                else {
                  (instruction->raw).field_3.evex.offset = bVar25;
                  instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_EVEX;
                  if (prefix_bytes[0] != 'b') {
                    __assert_fail("data[0] == 0x62",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0x216,
                                  "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  if (bVar42 - 4 != (uint)bVar25) {
                    __assert_fail("instruction->raw.evex.offset == instruction->length - 4",
                                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                  ,0x217,
                                  "ZyanStatus ZydisDecodeEVEX(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                                 );
                  }
                  ZVar5 = instruction->machine_mode;
                  if (ZVar5 == ZYDIS_MACHINE_MODE_MAX_VALUE) {
                    return 0x80200001;
                  }
                  pZVar7 = local_c8->context;
                  *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x20;
                  (instruction->raw).field_3.rex.W = prefix_bytes[1] >> 7;
                  (instruction->raw).field_3.rex.R = prefix_bytes[1] >> 6 & 1;
                  (instruction->raw).field_3.rex.X = prefix_bytes[1] >> 5 & 1;
                  (instruction->raw).field_3.rex.B = prefix_bytes[1] >> 4 & 1;
                  if ((prefix_bytes[1] & 8) != 0) {
                    return 0x80200008;
                  }
                  uVar37 = prefix_bytes[1] & 7;
                  *pZVar2 = (ZyanU8)uVar37;
                  if ((uVar37 < 8) && ((0x91U >> uVar37 & 1) != 0)) {
                    return 0x80200007;
                  }
                  (instruction->raw).field_3.xop.vvvv = prefix_bytes[2] >> 7;
                  (instruction->raw).field_3.xop.L = prefix_bytes[2] >> 3 & 0xf;
                  (instruction->raw).field_3.xop.pp = prefix_bytes[2] & 3;
                  (instruction->raw).field_3.xop.offset = prefix_bytes[3] >> 7;
                  (instruction->raw).field_3.vex.size = prefix_bytes[3] >> 6 & 1;
                  (instruction->raw).field_3.evex.L = prefix_bytes[3] >> 5 & 1;
                  (instruction->raw).field_3.evex.b = prefix_bytes[3] >> 4 & 1;
                  bVar42 = prefix_bytes[3] >> 3 & 1;
                  (instruction->raw).field_3.evex.V2 = bVar42;
                  if ((ZVar5 != ZYDIS_MACHINE_MODE_LONG_64) && (bVar42 == 0)) {
                    return 0x80200008;
                  }
                  (instruction->raw).field_3.evex.aaa = prefix_bytes[3] & 7;
                  (pZVar7->vector_unified).W = prefix_bytes[2] >> 7;
                  (pZVar7->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
                  (pZVar7->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
                  (pZVar7->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
                  bVar42 = prefix_bytes[3] >> 5 & 3;
                  (pZVar7->vector_unified).LL = bVar42;
                  (pZVar7->vector_unified).R2 = ~(instruction->raw).field_3.rex.B & 1;
                  (pZVar7->vector_unified).V2 = ~(instruction->raw).field_3.evex.V2 & 1;
                  (pZVar7->vector_unified).vvvv = ~(instruction->raw).field_3.xop.L & 0xf;
                  (pZVar7->vector_unified).mask = (instruction->raw).field_3.evex.aaa;
                  if ((ZVar5 != ZYDIS_MACHINE_MODE_LONG_64) &&
                     ((instruction->raw).field_3.evex.V2 == '\0')) {
                    return 0x80200008;
                  }
                  if ((bVar42 == 3) && ((instruction->raw).field_3.evex.b == '\0')) {
                    return 0x80200008;
                  }
                }
              }
              ZVar18 = (ZydisOpcodeMap)*pZVar29;
LAB_00110488:
              instruction->opcode_map = ZVar18;
            }
            else if (bVar42 == 0x8f) {
              if (0xe < instruction->length) {
                return 0x80200002;
              }
              if (local_c8->buffer_len == 0) {
                return 0x80200000;
              }
              if ((*local_c8->buffer & 0x18) != 0) {
                if ((instruction->attributes & 4) != 0) {
                  return 0x80200006;
                }
                if ((local_c8->prefixes).has_lock != '\0') {
                  return 0x80200004;
                }
                if ((local_c8->prefixes).mandatory_candidate != '\0') {
                  return 0x80200005;
                }
                (instruction->raw).field_3.xop.offset = instruction->length - 1;
                prefix_bytes[2] = '\0';
                prefix_bytes[0] = 0x8f;
                prefix_bytes[1] = '\0';
                ZVar19 = ZydisInputNextBytes(local_c8,instruction,prefix_bytes + 1,'\x02');
                if ((int)ZVar19 < 0) {
                  return ZVar19;
                }
                instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_XOP;
                if (prefix_bytes[0] != 0x8f) {
                  __assert_fail("data[0] == 0x8F",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x196,
                                "ZyanStatus ZydisDecodeXOP(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if ((prefix_bytes[1] & 0x18) == 0) {
                  __assert_fail("((data[1] >> 0) & 0x1F) >= 8",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x197,
                                "ZyanStatus ZydisDecodeXOP(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if (instruction->length - 3 != (uint)(instruction->raw).field_3.xop.offset) {
                  __assert_fail("instruction->raw.xop.offset == instruction->length - 3",
                                "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                                ,0x198,
                                "ZyanStatus ZydisDecodeXOP(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZyanU8 *)"
                               );
                }
                if (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE) {
                  return 0x80200001;
                }
                pZVar7 = local_c8->context;
                *(byte *)&instruction->attributes = (byte)instruction->attributes | 8;
                (instruction->raw).field_3.rex.W = prefix_bytes[1] >> 7;
                (instruction->raw).field_3.rex.R = prefix_bytes[1] >> 6 & 1;
                (instruction->raw).field_3.rex.X = prefix_bytes[1] >> 5 & 1;
                (instruction->raw).field_3.rex.B = prefix_bytes[1] & 0x1f;
                if ((byte)((prefix_bytes[1] & 0x1f) - 0xb) < 0xfd) {
                  return 0x80200007;
                }
                (instruction->raw).field_3.rex.offset = prefix_bytes[2] >> 7;
                (instruction->raw).field_3.xop.vvvv = prefix_bytes[2] >> 3 & 0xf;
                (instruction->raw).field_3.xop.L = prefix_bytes[2] >> 2 & 1;
                (instruction->raw).field_3.xop.pp = prefix_bytes[2] & 3;
                (pZVar7->vector_unified).W = prefix_bytes[2] >> 7;
                (pZVar7->vector_unified).R = ~(instruction->raw).field_3.rex.W & 1;
                (pZVar7->vector_unified).X = ~(instruction->raw).field_3.rex.R & 1;
                (pZVar7->vector_unified).B = ~(instruction->raw).field_3.rex.X & 1;
                ZVar13 = (instruction->raw).field_3.xop.L;
                (pZVar7->vector_unified).L = ZVar13;
                (pZVar7->vector_unified).LL = ZVar13;
                (pZVar7->vector_unified).vvvv = ~(instruction->raw).field_3.xop.vvvv & 0xf;
                ZVar18 = (instruction->raw).field_3.rex.B + ZYDIS_OPCODE_MAP_0F;
                goto LAB_00110488;
              }
            }
            else {
              if (bVar42 == 0x62) goto LAB_0010fede;
              if (bVar42 == 0xf) {
                instruction->opcode_map = ZYDIS_OPCODE_MAP_0F;
              }
            }
          }
          else {
            if (ZVar18 != ZYDIS_OPCODE_MAP_0F) goto LAB_00112519;
            ZVar13 = *pZVar35;
            if (ZVar13 == ':') {
              instruction->opcode_map = ZYDIS_OPCODE_MAP_0F3A;
            }
            else if (ZVar13 == '8') {
              instruction->opcode_map = ZYDIS_OPCODE_MAP_0F38;
            }
            else if (ZVar13 == '\x0f') {
              if ((local_c8->prefixes).has_lock != '\0') {
                return 0x80200004;
              }
              instruction->encoding = ZYDIS_INSTRUCTION_ENCODING_3DNOW;
              instruction->opcode_map = ZYDIS_OPCODE_MAP_0F0F;
            }
          }
        }
LAB_0010fd81:
        ZVar17 = (ushort)*pZVar35;
      }
      break;
    case '\x05':
      if (5 < (ulong)instruction->machine_mode) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xefa,
                      "ZyanStatus ZydisNodeHandlerMode(const ZydisDecodedInstruction *, ZyanU16 *)")
        ;
      }
      ZVar17 = *(ZyanU16 *)(&DAT_0011e020 + (ulong)instruction->machine_mode * 2);
      break;
    case '\x06':
      bVar54 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
      goto LAB_0010fc79;
    case '\a':
      ZVar19 = ZydisNodeHandlerModrmMod(local_c8,instruction,&index);
      ZVar17 = index;
      if ((int)ZVar19 < 0) {
        return ZVar19;
      }
      break;
    case '\b':
      ZVar19 = ZydisNodeHandlerModrmMod(local_c8,instruction,&index);
      if ((int)ZVar19 < 0) {
        return ZVar19;
      }
      bVar54 = index == 3;
      goto LAB_0010fc79;
    case '\t':
      if ((instruction->raw).modrm.offset == '\0') {
        (instruction->raw).modrm.offset = instruction->length;
        ZVar19 = ZydisInputNext(local_c8,instruction,prefix_bytes);
        if ((int)ZVar19 < 0) {
          return ZVar19;
        }
        ZydisDecodeModRM(instruction,prefix_bytes[0]);
      }
      ZVar17 = (ushort)(instruction->raw).modrm.reg;
      break;
    case '\n':
      if ((instruction->raw).modrm.offset == '\0') {
        (instruction->raw).modrm.offset = instruction->length;
        ZVar19 = ZydisInputNext(local_c8,instruction,prefix_bytes);
        if ((int)ZVar19 < 0) {
          return ZVar19;
        }
        ZydisDecodeModRM(instruction,prefix_bytes[0]);
      }
      ZVar17 = (ushort)(instruction->raw).modrm.rm;
      break;
    case '\v':
      bVar54 = (local_c8->prefixes).group1 == '\0';
LAB_0010fc79:
      ZVar17 = (ushort)!bVar54;
      break;
    case '\f':
      ZVar13 = (local_c8->prefixes).mandatory_candidate;
      if (ZVar13 == 0xf3) {
        (instruction->raw).prefixes[(local_c8->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        index = 3;
      }
      else if (ZVar13 == 0xf2) {
        (instruction->raw).prefixes[(local_c8->prefixes).offset_mandatory].type =
             ZYDIS_PREFIX_TYPE_MANDATORY;
        index = 4;
      }
      else {
        index = 1;
        if (ZVar13 == 'f') {
          (instruction->raw).prefixes[(local_c8->prefixes).offset_mandatory].type =
               ZYDIS_PREFIX_TYPE_MANDATORY;
          pbVar1 = (byte *)((long)&instruction->attributes + 5);
          *pbVar1 = *pbVar1 & 0xf7;
          index = 2;
        }
      }
      pZVar21 = ZydisDecoderTreeGetChildNode(node,0);
      ZVar17 = index;
      break;
    case '\r':
      ZVar5 = instruction->machine_mode;
      if ((ZVar5 != ZYDIS_MACHINE_MODE_LONG_64) ||
         (ZVar17 = 2, (local_c8->context->vector_unified).W == '\0')) {
        uVar23 = instruction->attributes;
        if ((uVar23 & 0x80000000000) != 0) {
          (instruction->raw).prefixes[(local_c8->prefixes).offset_osz_override].type =
               ZYDIS_PREFIX_TYPE_EFFECTIVE;
        }
        if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar5) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xf88,
                        "ZyanStatus ZydisNodeHandlerOperandSize(const ZydisDecoderState *, ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        if ((0xbU >> (ZVar5 & 0x1f) & 1) == 0) {
          uVar15 = (ushort)(uint)(uVar23 >> 0x2b);
          goto LAB_0010fd3a;
        }
        ZVar17 = (ushort)((uVar23 & 0x80000000000) == 0);
      }
      break;
    case '\x0e':
      ZVar5 = instruction->machine_mode;
      if (ZYDIS_MACHINE_MODE_MAX_VALUE < ZVar5) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfa8,
                      "ZyanStatus ZydisNodeHandlerAddressSize(ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((0x34U >> (ZVar5 & 0x1f) & 1) == 0) {
        if ((10U >> (ZVar5 & 0x1f) & 1) == 0) {
          ZVar17 = ((instruction->attributes & 0x100000000000) == 0) + 1;
        }
        else {
          ZVar17 = (ushort)((instruction->attributes & 0x100000000000) == 0);
        }
      }
      else {
        uVar15 = (ushort)(uint)(instruction->attributes >> 0x2c);
LAB_0010fd3a:
        ZVar17 = uVar15 & 1;
      }
      break;
    case '\x0f':
      if (local_c8->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfb1,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfb8,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfbb,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfbe,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfc1,
                        "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfc4,
                      "ZyanStatus ZydisNodeHandlerVectorLength(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar17 = (ZyanU16)(local_c8->context->vector_unified).LL;
      if (ZVar17 == 3) {
        return 0x80200001;
      }
      break;
    case '\x10':
      if (local_c8->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfd2,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xfe8,
                      "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfdc,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfdf,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfe2,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xfe5,
                        "ZyanStatus ZydisNodeHandlerRexW(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar17 = (ushort)(local_c8->context->vector_unified).W;
      break;
    case '\x11':
      if (local_c8->context == (ZydisDecoderContext *)0x0) {
        __assert_fail("context",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xff1,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      switch(instruction->encoding) {
      case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1007,
                      "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      case ZYDIS_INSTRUCTION_ENCODING_XOP:
        if ((instruction->attributes & 8) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 3)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xffb,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
        if ((instruction->attributes & 0x10) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 4)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xffe,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_EVEX:
        if ((instruction->attributes & 0x20) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 5)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1001,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
        break;
      case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
        if ((instruction->attributes & 0x40) == 0) {
          __assert_fail("instruction->attributes & (1ULL << 6)",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x1004,
                        "ZyanStatus ZydisNodeHandlerRexB(const ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU16 *)"
                       );
        }
      }
      ZVar17 = (ushort)(local_c8->context->vector_unified).B;
      break;
    case '\x12':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1013,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x20) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 5)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1014,
                      "ZyanStatus ZydisNodeHandlerEvexB(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar17 = (ushort)(instruction->raw).field_3.evex.b;
      break;
    case '\x13':
      if (instruction->encoding != ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE) {
        __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_MVEX",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1020,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      if ((instruction->attributes & 0x40) == 0) {
        __assert_fail("instruction->attributes & (1ULL << 6)",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x1021,
                      "ZyanStatus ZydisNodeHandlerMvexE(const ZydisDecodedInstruction *, ZyanU16 *)"
                     );
      }
      ZVar17 = (ushort)(instruction->raw).field_3.xop.offset;
      break;
    case '\x14':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 1;
      goto LAB_0010fcee;
    case '\x15':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 2;
      goto LAB_0010fcee;
    case '\x16':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 3;
      goto LAB_0010fcee;
    case '\x17':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 4;
      goto LAB_0010fcee;
    case '\x18':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 5;
      goto LAB_0010fcee;
    case '\x19':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 6;
      goto LAB_0010fcee;
    case '\x1a':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 7;
      goto LAB_0010fcee;
    case '\x1b':
      uVar15 = (ushort)*(byte *)((long)&local_c8->decoder->decoder_mode + 1);
      goto LAB_0010fcee;
    case '\x1c':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 9;
      goto LAB_0010fcee;
    case '\x1d':
      uVar15 = (ushort)local_c8->decoder->decoder_mode >> 10;
LAB_0010fcee:
      ZVar17 = uVar15 & 1;
      break;
    default:
      goto switchD_0010f7e7_default;
    }
    index = ZVar17;
    node = ZydisDecoderTreeGetChildNode(node,index);
    pZVar22 = pZVar21;
  } while( true );
switchD_0011168f_caseD_4:
  if (0xbf < bVar26) {
    __assert_fail("def->element_size < (sizeof(scales) / sizeof((scales)[0]))",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x9f1,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar13 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_82 + (ulong)(bVar26 >> 5));
  goto LAB_001123e9;
switchD_0010f7e7_default:
  if (-1 < (char)node->type) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x131c,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  ZydisGetInstructionDefinition
            (instruction->encoding,node->value,(ZydisInstructionDefinition **)prefix_bytes);
  pZVar7 = local_c8->context;
  if (pZVar7 == (ZydisDecoderContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1a,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  puVar10 = (ulong *)CONCAT44(uStack_ac,
                              CONCAT13(prefix_bytes[3],
                                       CONCAT12(prefix_bytes[2],
                                                CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
  if (puVar10 == (ulong *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xd1c,
                  "void ZydisSetEffectiveOperandWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar23 = instruction->attributes;
  bVar42 = (byte)(uVar23 >> 0x2b) & 1;
  ZVar5 = instruction->machine_mode;
  if (ZVar5 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar42 = bVar42 | (pZVar7->vector_unified).W * '\x02' & 2 | 4;
  }
  else if ((ZVar5 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar5 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar42 = bVar42 | 2;
  }
  bVar42 = ZydisSetEffectiveOperandWidth_operand_size_map
           [(ulong)bVar42 + (ulong)((uint)(*puVar10 >> 0x21) & 7) * 8];
  instruction->operand_width = bVar42;
  pZVar7->eosz_index = bVar42 >> 5;
  if ((*puVar10 & 0xe00000000) == 0x200000000) {
    instruction->operand_width = '\b';
  }
  bVar42 = (byte)(uVar23 >> 0x2c) & 1;
  if (ZVar5 == ZYDIS_MACHINE_MODE_LONG_64) {
    bVar42 = bVar42 | 4;
  }
  else if ((ZVar5 == ZYDIS_MACHINE_MODE_LEGACY_32) || (ZVar5 == ZYDIS_MACHINE_MODE_LONG_COMPAT_32))
  {
    bVar42 = bVar42 | 2;
  }
  uVar23 = (ulong)((uint)(*puVar10 >> 0x24) & 3);
  if (uVar23 == 3) {
    __assert_fail("definition->address_size_map < (sizeof(address_size_map) / sizeof((address_size_map)[0]))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xdcc,
                  "void ZydisSetEffectiveAddressWidth(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  bVar42 = ZydisSetEffectiveAddressWidth_address_size_map[(ulong)bVar42 + uVar23 * 8];
  instruction->address_width = bVar42;
  pZVar7->easz_index = bVar42 >> 5;
  ZydisGetInstructionEncodingInfo(node,&info);
  if (info == (ZydisInstructionEncodingInfo *)0x0) {
    __assert_fail("info",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xc95,
                  "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                 );
  }
  pZVar7 = local_c8->context;
  bVar42 = info->flags;
  if ((bVar42 & 1) != 0) {
    if ((instruction->raw).modrm.offset == '\0') {
      (instruction->raw).modrm.offset = instruction->length;
      ZVar19 = ZydisInputNext(local_c8,instruction,&modrm_byte_2);
      if ((int)ZVar19 < 0) {
        return ZVar19;
      }
      ZydisDecodeModRM(instruction,modrm_byte_2);
      bVar42 = info->flags;
    }
    if ((bVar42 & 0x10) == 0) {
      ZVar13 = instruction->address_width;
      if ((ZVar13 != '@') && (ZVar13 != ' ')) {
        if (ZVar13 != '\x10') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xcdb,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
        switch((instruction->raw).modrm.mod) {
        case '\0':
          ZVar13 = '\x10';
          if ((instruction->raw).modrm.rm == '\x06') break;
          goto LAB_001109e9;
        case '\x01':
          ZVar13 = '\b';
          break;
        case '\x02':
          ZVar13 = '\x10';
          break;
        case '\x03':
          bVar25 = 1;
          goto LAB_001109f1;
        default:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0xcbb,
                        "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                       );
        }
LAB_001109c2:
        ZVar19 = ZydisReadDisplacement(local_c8,instruction,ZVar13);
        if ((int)ZVar19 < 0) {
          return ZVar19;
        }
        goto LAB_001109db;
      }
      ZVar3 = (instruction->raw).modrm.mod;
      bVar25 = 1;
      if (ZVar3 != '\x03') {
        ZVar4 = (instruction->raw).modrm.rm;
        if (ZVar3 == '\x02') {
          ZVar13 = ' ';
        }
        else {
          ZVar13 = '\b';
          if (ZVar3 != '\x01') {
            if (ZVar3 != '\0') {
              __assert_fail("0",
                            "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                            ,0xcd7,
                            "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                           );
            }
            if (ZVar4 == '\x05') {
              ZVar13 = ' ';
              if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
                *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
              }
              goto LAB_001109c2;
            }
            ZVar13 = '\0';
          }
        }
        if (ZVar4 == '\x04') {
          (instruction->raw).sib.offset = instruction->length;
          ZVar19 = ZydisInputNext(local_c8,instruction,&modrm_byte_2);
          if ((int)ZVar19 < 0) {
            return ZVar19;
          }
          uVar23 = instruction->attributes;
          if ((uVar23 & 1) == 0) {
            __assert_fail("instruction->attributes & (1ULL << 0)",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x2c0,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if ((instruction->raw).modrm.rm != '\x04') {
            __assert_fail("instruction->raw.modrm.rm == 4",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x2c1,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if ((uVar23 & 2) != 0) {
            __assert_fail("!(instruction->attributes & (1ULL << 1))",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x2c2,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          if (instruction->length - 1 != (uint)(instruction->raw).sib.offset) {
            __assert_fail("instruction->raw.sib.offset == instruction->length - 1",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x2c3,"void ZydisDecodeSIB(ZydisDecodedInstruction *, ZyanU8)");
          }
          instruction->attributes = uVar23 | 2;
          (instruction->raw).sib.scale = modrm_byte_2 >> 6;
          (instruction->raw).sib.index = modrm_byte_2 >> 3 & 7;
          (instruction->raw).sib.base = modrm_byte_2 & 7;
          if (((modrm_byte_2 & 7) == 5) && (ZVar13 = ' ', (instruction->raw).modrm.mod == '\x01')) {
            ZVar13 = '\b';
          }
        }
        if (ZVar13 != '\0') goto LAB_001109c2;
        goto LAB_001109db;
      }
    }
    else {
LAB_001109db:
      bVar42 = info->flags;
      bVar25 = 1;
      if ((instruction->raw).modrm.mod != '\x03') {
LAB_001109e9:
        bVar25 = bVar42 >> 4 & 1;
      }
    }
LAB_001109f1:
    (pZVar7->reg_info).is_mod_reg = bVar25;
  }
  if ((bVar42 & 2) != 0) {
    ZVar19 = ZydisReadDisplacement(local_c8,instruction,(info->disp).size[pZVar7->easz_index]);
    if ((int)ZVar19 < 0) {
      return ZVar19;
    }
    bVar42 = info->flags;
  }
  if ((bVar42 & 4) != 0) {
    ZVar14 = info->imm[0].is_relative;
    if (ZVar14 != '\0') {
      *(byte *)&instruction->attributes = (byte)instruction->attributes | 0x80;
    }
    ZVar19 = ZydisReadImmediate(local_c8,instruction,'\0',info->imm[0].size[pZVar7->eosz_index],
                                info->imm[0].is_signed,ZVar14);
    if ((int)ZVar19 < 0) {
      return ZVar19;
    }
    bVar42 = info->flags;
  }
  if ((bVar42 & 8) != 0) {
    if ((bVar42 & 2) != 0) {
      __assert_fail("!(info->flags & 0x02)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xd05,
                    "ZyanStatus ZydisDecodeOptionalInstructionParts(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionEncodingInfo *)"
                   );
    }
    ZVar19 = ZydisReadImmediate(local_c8,instruction,'\x01',info->imm[1].size[pZVar7->eosz_index],
                                info->imm[1].is_signed,info->imm[1].is_relative);
    if ((int)ZVar19 < 0) {
      return ZVar19;
    }
  }
  def = (ZydisInstructionDefinitionLEGACY *)
        CONCAT44(uStack_ac,
                 CONCAT13(prefix_bytes[3],
                          CONCAT12(prefix_bytes[2],CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
  if (def == (ZydisInstructionDefinitionLEGACY *)0x0) {
    __assert_fail("definition",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x1103,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar6 = instruction->encoding;
  if (ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE < ZVar6) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x119e,
                  "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  uVar37 = *(uint *)&def->field_0x8;
  switch(ZVar6) {
  case ZYDIS_INSTRUCTION_ENCODING_LEGACY:
    local_ba = true;
    if (((*(ulong *)def >> 0x2d & 1) != 0) &&
       (instruction->machine_mode == ZYDIS_MACHINE_MODE_MAX_VALUE)) {
      return 0x80200001;
    }
    if (((*(ulong *)def >> 0x2e & 1) != 0) &&
       (instruction->machine_mode - ZYDIS_MACHINE_MODE_LONG_COMPAT_32 < 2)) {
      return 0x80200001;
    }
    uVar15 = 0;
    bVar25 = 0;
    bVar42 = 0;
    uVar23 = 0;
    if ((local_c8->prefixes).has_lock != '\0' && -1 < (int)uVar37) {
      return 0x80200004;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_3DNOW:
    local_ba = true;
    uVar15 = 0;
    bVar25 = 0;
    bVar42 = 0;
    uVar23 = 0;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    local_ba = true;
    uVar23 = (ulong)(*(uint5 *)&def->field_0x8 >> 0x1e & 0xff) & 0xffffffffffffff1f;
    uVar15 = 0;
    bVar25 = 0;
    bVar42 = 0;
    break;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    uVar23 = (ulong)(*(uint6 *)&def->field_0x8 >> 0x1e);
    bVar42 = (byte)*(undefined2 *)&def->field_0xc;
    local_ba = (*(uint6 *)&def->field_0x8 & 0x2000000000) == 0;
    uVar15 = 0;
    goto LAB_00110cd6;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    local_ba = true;
    uVar23 = (ulong)(*(uint5 *)&def->field_0x8 >> 0x1e & 0xff) & 0xffffffffffffff1f;
    bVar42 = (byte)def->field_0xc >> 3 & 1;
    bVar25 = (byte)def->field_0xc >> 4 & 1;
    uVar15 = *(ushort *)(def + 1) >> 2 & 3;
    if (((instruction->raw).field_3.xop.offset != '\0') && ((*(ushort *)(def + 1) & 0x10) == 0)) {
      return 0x8020000a;
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    uVar15 = *(ushort *)&def->field_0xc;
    uVar23 = (ulong)(uVar15 >> 6 & 0x1f);
    if (0x19 < uVar23) {
      __assert_fail("def->functionality < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1192,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar44 = (ulong)(instruction->raw).field_3.vex.size;
    if (7 < uVar44) {
      __assert_fail("instruction->raw.mvex.SSS < 8",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1193,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZydisCheckErrorConditions_lookup[uVar44 + uVar23 * 8] == '\0') {
      return 0x80200001;
    }
    local_ba = true;
    uVar23 = (ulong)(byte)(CONCAT24(uVar15,*(undefined4 *)&def->field_0x8) >> 0x1e);
    bVar42 = (byte)uVar15;
    uVar15 = uVar15 >> 0xb & 3;
LAB_00110cd6:
    bVar42 = bVar42 >> 3 & 1;
    uVar23 = uVar23 & 0xffffffffffffff1f;
    bVar25 = 0;
  }
  bVar43 = (byte)(uVar37 >> 0xd);
  uVar38 = uVar37 >> 0x12;
  local_b8 = local_c8->context;
  ZVar14 = (local_b8->reg_info).is_mod_reg;
  uVar39 = 0;
  uVar44 = (ulong)(bVar43 & 0xf);
  if ((uVar37 >> 0xd & 0x1f) == 0) {
    uVar44 = 0;
  }
  if ((uVar38 & 0x1f) == 0) {
LAB_00110d62:
    uVar40 = 0;
LAB_00110d65:
    bVar30 = (instruction->raw).modrm.rm;
  }
  else {
    if (ZVar14 != '\0') {
      uVar39 = uVar38 & 0xffffff0f;
      uVar40 = CONCAT71((int7)((ulong)pZVar7 >> 8),0xf < ((byte)uVar38 & 0x1f));
      goto LAB_00110d65;
    }
    uVar39 = uVar38 & 0xffffff07;
    if ((((uVar38 & 8) == 0) || (local_c8->decoder->machine_mode != ZYDIS_MACHINE_MODE_LONG_64)) ||
       ((instruction->raw).modrm.mod != '\0')) goto LAB_00110d62;
    bVar30 = (instruction->raw).modrm.rm;
    if (bVar30 == 5) {
      return 0x80200003;
    }
    uVar40 = 0;
  }
  bVar54 = bVar30 == 4;
  bVar8 = ZVar14 == '\0';
  cVar48 = (char)uVar39;
  bVar26 = (instruction->raw).modrm.reg;
  bVar36 = (local_b8->vector_unified).vvvv;
  local_48 = (ulong)(uVar39 & 0xff);
  if (instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64) {
    local_4c = (undefined4)uVar40;
    local_b9 = (local_b8->vector_unified).V2 << 4;
    bVar51 = local_b9;
    if (cVar48 != '\x04' || (!bVar54 || !bVar8)) {
      bVar51 = 0;
    }
    ZVar13 = (local_b8->vector_unified).X;
    bVar50 = ZVar13 << 4;
    if (ZVar6 < ZYDIS_INSTRUCTION_ENCODING_EVEX) {
      bVar50 = 0;
    }
    bVar46 = (local_b8->vector_unified).B << 3;
    if (ZVar14 == '\0') {
      bVar49 = 0xff;
    }
    else {
      bVar49 = ZydisPopulateRegisterIds_mask_rm[local_48];
    }
    bVar49 = bVar49 & (bVar30 | bVar46 | bVar50);
    local_b9 = local_b9 | bVar36;
    bVar46 = bVar46 | *(ZyanU8 *)
                       ((long)((instruction->raw).imm + -1) + (ulong)(bVar54 && bVar8) * 4 + 1);
    bVar51 = bVar51 | (instruction->raw).sib.index | ZVar13 << 3;
    bVar26 = ((local_b8->vector_unified).R << 3 | (local_b8->vector_unified).R2 << 4 | bVar26) &
             ZydisPopulateRegisterIds_mask_reg[uVar44];
    uVar40 = uVar40 & 0xffffffff;
  }
  else {
    local_b9 = bVar36 & 7;
    bVar46 = *(ZyanU8 *)((long)((instruction->raw).imm + -1) + (ulong)(bVar54 && bVar8) * 4 + 1);
    bVar51 = (instruction->raw).sib.index;
    bVar49 = bVar30;
  }
  cVar47 = (char)uVar23;
  if (cVar47 == '\0') {
    if (bVar36 != 0) {
      return 0x80200003;
    }
    if ((cVar48 != '\x04' || (!bVar54 || !bVar8)) && ((local_b8->vector_unified).V2 != '\0')) {
      return 0x80200003;
    }
  }
  bVar54 = instruction->machine_mode == ZYDIS_MACHINE_MODE_LONG_64;
  if ((byte)ZydisPopulateRegisterIds_available_regs[uVar44 + (ulong)bVar54 * 0xc] <= bVar26) {
    return 0x80200003;
  }
  if ((byte)ZydisPopulateRegisterIds_available_regs[(uVar23 & 0xff) + (ulong)bVar54 * 0xc] <=
      local_b9) {
    return 0x80200003;
  }
  if ((ZVar14 != '\0') &&
     ((byte)ZydisPopulateRegisterIds_available_regs[local_48 + (ulong)bVar54 * 0xc] <= bVar49)) {
    return 0x80200003;
  }
  cVar27 = (char)uVar44;
  bVar36 = 0xff;
  if (cVar27 == '\b') {
    bVar36 = bVar26;
  }
  bVar50 = bVar49;
  if (cVar48 != '\b') {
    bVar50 = bVar36;
  }
  if (ZVar14 == '\0') {
    bVar50 = bVar36;
  }
  if (-1 < (char)bVar50) {
    if (0xf < bVar50) {
      __assert_fail("(ZyanUSize)id_cr < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x10e1,
                    "ZyanStatus ZydisPopulateRegisterIds(ZydisDecoderContext *, const ZydisDecodedInstruction *, ZyanU8, ZyanU8, ZyanU8)"
                   );
    }
    if ((0xfee2UL >> ((ulong)bVar50 & 0x3f) & 1) != 0) {
      return 0x80200003;
    }
  }
  bVar52 = -(cVar27 == '\0') | bVar26;
  (local_b8->reg_info).id_reg = bVar52;
  bVar50 = -(ZVar14 == '\0') | -(cVar48 == '\0') | bVar49;
  (local_b8->reg_info).id_rm = bVar50;
  bVar36 = -(cVar47 == '\0') | local_b9;
  (local_b8->reg_info).id_ndsndd = bVar36;
  (local_b8->reg_info).id_base = bVar46;
  (local_b8->reg_info).id_index = bVar51;
  if (0xf < (bVar43 & 0x1f) && bVar52 == 1) {
    return 0x80200003;
  }
  if (((byte)uVar40 & bVar50 == 1) != 0) {
    return 0x80200003;
  }
  if (bVar42 != 0) {
    if ((instruction->raw).modrm.mod == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x11d7,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar30 != 4) {
      __assert_fail("instruction->raw.modrm.rm == 4",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x11d8,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    bVar42 = bVar52;
    if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      if (((cVar27 != '\x04') || (cVar48 != '\x04')) || (bVar43 = local_b9, cVar47 != '\x04')) {
        __assert_fail("(def_reg == ZYDIS_REGKIND_VR) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_VR)"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x11e2,
                      "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      bVar43 = 0xf0;
      if ((ZVar6 & ~ZYDIS_INSTRUCTION_ENCODING_3DNOW) == ZYDIS_INSTRUCTION_ENCODING_EVEX) {
        if (((cVar47 != '\0') || ((uVar44 & 0xb) != 0)) || (cVar48 != '\x04')) {
          __assert_fail("((def_reg == ZYDIS_REGKIND_INVALID) || (def_reg == ZYDIS_REGKIND_VR)) && (def_rm == ZYDIS_MEMOP_TYPE_VSIB) && (def_ndsndd == ZYDIS_REGKIND_INVALID)"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x11ec,
                        "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        bVar42 = bVar26;
        bVar43 = 0xf0;
        if (cVar27 == '\0') {
          bVar42 = 0xf1;
        }
      }
    }
    if (bVar42 == bVar51) {
      return 0x80200003;
    }
    if (bVar43 == bVar42) {
      return 0x80200003;
    }
    if (bVar43 == bVar51) {
      return 0x80200003;
    }
  }
  if (bVar25 != 0) {
    if (1 < ZVar6 - ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      __assert_fail("(instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_EVEX) || (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1202,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar52 == bVar36) {
      return 0x80200003;
    }
    if (ZVar14 != '\0' && bVar52 == bVar50) {
      return 0x80200003;
    }
  }
  if (local_ba == false) {
    if (ZVar6 != ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS) {
      __assert_fail("instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_VEX",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1212,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (ZVar14 == '\0') {
      __assert_fail("is_reg",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x1213,
                    "ZyanStatus ZydisCheckErrorConditions(ZydisDecoderState *, const ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar52 == bVar36) {
      return 0x80200003;
    }
    if (bVar36 == bVar50) {
      return 0x80200003;
    }
    if (bVar52 == bVar50) {
      return 0x80200003;
    }
  }
  if (1 < uVar15) {
    if (uVar15 == 3) {
      if ((local_b8->vector_unified).mask != '\0') {
        return 0x8020000a;
      }
    }
    else if ((local_b8->vector_unified).mask == '\0') {
      return 0x8020000a;
    }
  }
  if (ZVar6 == ZYDIS_INSTRUCTION_ENCODING_3DNOW) {
    ZVar19 = ZydisInputNext(local_c8,instruction,pZVar35);
    if ((int)ZVar19 < 0) {
      return ZVar19;
    }
    pZVar22 = ZydisDecoderTreeGetChildNode(&zydis_decoder_tree_root,0xf);
    pZVar22 = ZydisDecoderTreeGetChildNode(pZVar22,0xf);
    pZVar22 = ZydisDecoderTreeGetChildNode(pZVar22,(ushort)*pZVar35);
    if (pZVar22->type == '\0') {
      return 0x80200001;
    }
    if (pZVar22->type != '\b') {
      __assert_fail("node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x12e6,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    pZVar22 = ZydisDecoderTreeGetChildNode(pZVar22,(ushort)((instruction->raw).modrm.mod != '\x03'))
    ;
    if (-1 < (char)pZVar22->type) {
      __assert_fail("node->type & ZYDIS_NODETYPE_DEFINITION_MASK",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x12e9,
                    "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                   );
    }
    ZydisGetInstructionDefinition
              (instruction->encoding,pZVar22->value,(ZydisInstructionDefinition **)prefix_bytes);
    def = (ZydisInstructionDefinitionLEGACY *)
          CONCAT44(uStack_ac,
                   CONCAT13(prefix_bytes[3],
                            CONCAT12(prefix_bytes[2],CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
    local_b8 = local_c8->context;
  }
  instruction->mnemonic = *(ZydisMnemonic *)def & (ZYDIS_MNEMONIC_XSHA256|ZYDIS_MNEMONIC_FUCOM);
  instruction->operand_count = (byte)(*(uint *)def >> 0xb) & 0xf;
  instruction->operand_count_visible = (byte)(*(uint *)def >> 0xf) & 7;
  local_b8->definition = def;
  puVar11 = (undefined8 *)
            CONCAT44(uStack_ac,
                     CONCAT13(prefix_bytes[3],
                              CONCAT12(prefix_bytes[2],CONCAT11(prefix_bytes[1],prefix_bytes[0]))));
  ZVar20 = (ZydisInstructionCategory)((ulong)*puVar11 >> 0x2f) &
           (ZYDIS_CATEGORY_WRMSRNS|ZYDIS_CATEGORY_BINARY);
  (instruction->meta).category = ZVar20;
  (instruction->meta).isa_set =
       (ZydisISASet)((ulong)*puVar11 >> 0x36) &
       (ZYDIS_ISA_SET_WAITPKG|ZYDIS_ISA_SET_AVX512_VBMI_256);
  (instruction->meta).isa_ext =
       (uint)((ulong)*puVar11 >> 0x3e) + *(int *)(puVar11 + 1) * 4 &
       (ZYDIS_ISA_EXT_VTX|ZYDIS_ISA_EXT_F16C);
  ZVar31 = *(uint *)(puVar11 + 1) >> 5 & ZYDIS_BRANCH_TYPE_FAR;
  (instruction->meta).branch_type = ZVar31;
  if (((ZVar31 != ZYDIS_BRANCH_TYPE_NONE) &&
      ((0x3c < ZVar20 - ZYDIS_CATEGORY_CALL ||
       ((0x1000000000000101U >> ((ulong)(ZVar20 - ZYDIS_CATEGORY_CALL) & 0x3f) & 1) == 0)))) &&
     (ZVar20 != ZYDIS_CATEGORY_UNCOND_BR)) {
    __assert_fail("(instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) || ((instruction->meta.category == ZYDIS_CATEGORY_CALL) || (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) || (instruction->meta.category == ZYDIS_CATEGORY_RET))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0x12fd,
                  "ZyanStatus ZydisDecodeInstruction(ZydisDecoderState *, ZydisDecodedInstruction *)"
                 );
  }
  (instruction->meta).exception_class =
       *(uint *)(puVar11 + 1) >> 7 & (ZYDIS_EXCEPTION_CLASS_E10|ZYDIS_EXCEPTION_CLASS_E9NF);
  uVar37 = local_c8->decoder->decoder_mode;
  if ((uVar37 & 1) != 0) {
    return 0x100000;
  }
  uVar38 = *(uint *)(puVar11 + 1);
  if ((uVar38 >> 0x17 & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping + (ulong)((byte)(uVar38 >> 0x17) & 3) * 8);
    uVar38 = *(uint *)(puVar11 + 1);
  }
  bVar42 = (byte)(uVar38 >> 0x19) & 3;
  if (bVar42 != 0) {
    instruction->attributes =
         instruction->attributes | *(ulong *)(ZydisSetAttributes_mapping_60 + (ulong)bVar42 * 8);
    uVar38 = *(uint *)(puVar11 + 1);
  }
  if ((uVar38 >> 0x1b & 3) != 0) {
    instruction->attributes =
         instruction->attributes |
         *(ulong *)(ZydisSetAttributes_mapping_62 + (ulong)((byte)(uVar38 >> 0x1b) & 3) * 8);
  }
  ZVar6 = instruction->encoding;
  if (ZVar6 - ZYDIS_INSTRUCTION_ENCODING_3DNOW < 5) {
    if ((*(byte *)((long)puVar11 + 0xb) & 0x20) != 0) {
      uVar23 = instruction->attributes;
      uVar44 = uVar23 | 0x4000000;
      instruction->attributes = uVar44;
      ZVar13 = (local_c8->prefixes).effective_segment;
      if (ZVar13 != '\0') {
        if (ZVar13 == '&') {
          uVar44 = 0x10004000000;
        }
        else if (ZVar13 == '.') {
          uVar44 = 0x2004000000;
        }
        else if (ZVar13 == 'e') {
          uVar44 = 0x40004000000;
        }
        else if (ZVar13 == '>') {
          uVar44 = 0x8004000000;
        }
        else if (ZVar13 == 'd') {
          uVar44 = 0x20004000000;
        }
        else {
          if (ZVar13 != '6') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0x8cd,
                          "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          uVar44 = 0x4004000000;
        }
        uVar44 = uVar44 | uVar23;
        instruction->attributes = uVar44;
      }
      if ((uVar44 & 0x7e000000000) != 0) goto LAB_0011157d;
    }
  }
  else {
    if (ZVar6 != ZYDIS_INSTRUCTION_ENCODING_LEGACY) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x8d8,
                    "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar38 = *(uint *)(puVar11 + 1);
    if ((uVar38 >> 0x1e & 1) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 1);
      *pbVar1 = *pbVar1 | 1;
      uVar38 = *(uint *)(puVar11 + 1);
    }
    if ((int)uVar38 < 0) {
      uVar23 = instruction->attributes;
      instruction->attributes = uVar23 | 0x10000;
      if ((local_c8->prefixes).has_lock != '\0') {
        instruction->attributes = uVar23 | 0x8010000;
        (instruction->raw).prefixes[(local_c8->prefixes).offset_lock].type =
             ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    uVar15 = *(ushort *)((long)puVar11 + 0xc);
    if ((uVar15 & 1) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 2;
      uVar15 = *(ushort *)((long)puVar11 + 0xc);
    }
    if ((uVar15 & 2) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 4;
      uVar15 = *(ushort *)((long)puVar11 + 0xc);
    }
    if ((uVar15 & 4) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 8;
      uVar15 = *(ushort *)((long)puVar11 + 0xc);
    }
    if ((uVar15 & 8) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x10;
      uVar15 = *(ushort *)((long)puVar11 + 0xc);
    }
    if ((uVar15 & 0x10) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x20;
      uVar15 = *(ushort *)((long)puVar11 + 0xc);
    }
    cVar48 = (char)uVar15;
    if ((uVar15 & 0x20) != 0) {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x40;
      cVar48 = (char)*(undefined2 *)((long)puVar11 + 0xc);
    }
    if (cVar48 < '\0') {
      pbVar1 = (byte *)((long)&instruction->attributes + 2);
      *pbVar1 = *pbVar1 | 0x80;
    }
    ZVar13 = (local_c8->prefixes).group1;
    if (ZVar13 == 0xf3) {
      uVar23 = instruction->attributes;
      uVar38 = (uint)uVar23;
      if ((uVar38 >> 0x11 & 1) == 0) {
        if ((uVar38 >> 0x12 & 1) == 0) {
          if (((uVar38 >> 0x16 & 1) == 0) ||
             (((uVar38 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar11 + 0xc) & 0x80) == 0))))
          goto LAB_00111ad9;
          uVar23 = uVar23 | 0x200000000;
        }
        else {
          uVar23 = uVar23 | 0x20000000;
        }
      }
      else {
        uVar23 = uVar23 | 0x10000000;
      }
LAB_00111ad5:
      instruction->attributes = uVar23;
    }
    else if (ZVar13 == 0xf2) {
      uVar23 = instruction->attributes;
      uVar38 = (uint)uVar23;
      if ((uVar38 >> 0x13 & 1) == 0) {
        if (((uVar38 >> 0x15 & 1) == 0) ||
           (((uVar38 >> 0x1b & 1) == 0 && ((*(byte *)((long)puVar11 + 0xc) & 0x80) == 0)))) {
          if ((uVar38 >> 0x14 & 1) == 0 || (uVar37 & 8) == 0) goto LAB_00111ad9;
          uVar23 = uVar23 | 0x80000000;
        }
        else {
          uVar23 = uVar23 | 0x100000000;
        }
      }
      else {
        uVar23 = uVar23 | 0x40000000;
      }
      goto LAB_00111ad5;
    }
LAB_00111ad9:
    bVar42 = (local_c8->prefixes).offset_group1;
    if (((instruction->raw).prefixes[bVar42].type == ZYDIS_PREFIX_TYPE_IGNORED) &&
       ((instruction->attributes & 0x3f0000000) != 0)) {
      (instruction->raw).prefixes[bVar42].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
    if ((*(byte *)((long)puVar11 + 0xd) & 1) != 0) {
      uVar23 = instruction->attributes;
      instruction->attributes = uVar23 | 0x1000000;
      ZVar13 = (local_c8->prefixes).group2;
      if (ZVar13 == '.') {
        uVar44 = 0x401000000;
      }
      else {
        if (ZVar13 != '>') goto LAB_00111b61;
        uVar44 = 0x801000000;
      }
      instruction->attributes = uVar44 | uVar23;
      (instruction->raw).prefixes[(local_c8->prefixes).offset_group2].type =
           ZYDIS_PREFIX_TYPE_EFFECTIVE;
    }
LAB_00111b61:
    if ((*(byte *)((long)puVar11 + 0xc) & 0x40) != 0) {
      uVar23 = instruction->attributes;
      instruction->attributes = uVar23 | 0x2000000;
      if (((uVar37 & 0x10) != 0) &&
         (lVar45 = (long)(local_c8->prefixes).offset_notrack, -1 < lVar45)) {
        instruction->attributes = uVar23 | 0x1002000000;
        (instruction->raw).prefixes[lVar45].type = ZYDIS_PREFIX_TYPE_EFFECTIVE;
      }
    }
    if (((*(byte *)((long)puVar11 + 0xb) & 0x20) == 0) ||
       ((*(byte *)((long)puVar11 + 0xd) & 1) != 0)) goto switchD_001115a8_default;
    uVar23 = instruction->attributes;
    uVar44 = uVar23 | 0x4000000;
    instruction->attributes = uVar44;
    ZVar13 = (local_c8->prefixes).effective_segment;
    if ((uVar23 >> 0x24 & 1) == 0 && ZVar13 != '\0') {
      if (ZVar13 == '&') {
        uVar44 = 0x10004000000;
      }
      else if (ZVar13 == '.') {
        uVar44 = 0x2004000000;
      }
      else if (ZVar13 == 'e') {
        uVar44 = 0x40004000000;
      }
      else if (ZVar13 == '>') {
        uVar44 = 0x8004000000;
      }
      else if (ZVar13 == 'd') {
        uVar44 = 0x20004000000;
      }
      else {
        if (ZVar13 != '6') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                        ,0x8a2,
                        "void ZydisSetAttributes(ZydisDecoderState *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                       );
        }
        uVar44 = 0x4004000000;
      }
      uVar44 = uVar44 | uVar23;
      instruction->attributes = uVar44;
    }
    if ((uVar44 & 0x7e000000000) == 0) goto switchD_001115a8_default;
LAB_0011157d:
    (instruction->raw).prefixes[(local_c8->prefixes).offset_segment].type =
         ZYDIS_PREFIX_TYPE_EFFECTIVE;
  }
  switch(ZVar6) {
  case ZYDIS_INSTRUCTION_ENCODING_XOP:
    uVar23 = (ulong)(local_b8->vector_unified).LL;
    if (1 < uVar23) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x90d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_65 + uVar23 * 2);
    goto switchD_001115a8_default;
  case ZYDIS_INSTRUCTION_ENCODING_REQUIRED_BITS:
    uVar23 = (ulong)(local_b8->vector_unified).LL;
    if (1 < uVar23) {
      __assert_fail("context->vector_unified.LL < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x919,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).vector_length =
         *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_65 + uVar23 * 2);
    if ((*(ushort *)((long)puVar11 + 0xc) & 0x1c0) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      (instruction->avx).broadcast.mode =
           *(ZydisBroadcastMode *)
            (ZydisSetAVXInformation_broadcasts +
            (ulong)(*(ushort *)((long)puVar11 + 0xc) >> 6 & 7) * 4);
    }
    goto switchD_001115a8_default;
  case ZYDIS_INSTRUCTION_ENCODING_EVEX:
    bVar42 = (local_b8->vector_unified).LL;
    bVar25 = *(byte *)((long)puVar11 + 0xc) >> 6;
    bVar43 = bVar25 - 1;
    if (bVar25 == 0) {
      bVar43 = bVar42;
    }
    if (2 < bVar43) {
      __assert_fail("vector_length < (sizeof(lookup) / sizeof((lookup)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x942,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar23 = (ulong)bVar43;
    ZVar17 = *(ZyanU16 *)((long)&ZydisSetAVXInformation_lookup_66 + uVar23 * 2);
    (instruction->avx).vector_length = ZVar17;
    (local_b8->evex).tuple_type = *(byte *)((long)puVar11 + 0xd) & 0x1f;
    bVar25 = *(byte *)((long)puVar11 + 0xd);
    ZVar13 = (instruction->raw).modrm.mod;
    if ((bVar25 & 0x1f) == 0) {
      if (ZVar13 != '\x03') {
        __assert_fail("instruction->raw.modrm.mod == 3",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa7e,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_0011243a;
    }
    if (ZVar13 == '\x03') {
      __assert_fail("instruction->raw.modrm.mod != 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x948,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar25 < 0x20) {
      __assert_fail("def->element_size",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x949,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (0xbf < bVar25) {
      __assert_fail("def->element_size < (sizeof(element_sizes) / sizeof((element_sizes)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x950,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    break;
  case ZYDIS_INSTRUCTION_ENCODING_MAX_VALUE:
    (instruction->avx).vector_length = 0x200;
    uVar9 = *(uint3 *)((long)puVar11 + 0xc);
    if ((uVar9 & 0x1c000) != 0 && (uVar9 & 0x2000) != 0) {
      __assert_fail("!index || !def->broadcast",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xad2,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar37 = uVar9 >> 0xd & 1;
    uVar23 = (ulong)uVar37;
    bVar54 = true;
    if ((char)uVar37 == '\0' && (uVar9 & 0x1c000) != 0) {
      (instruction->avx).broadcast.is_static = '\x01';
      uVar37 = *(uint3 *)((long)puVar11 + 0xc) >> 0xe & 7;
      uVar23 = (ulong)uVar37;
      bVar54 = true;
      switch(uVar37) {
      case 1:
        ZVar53 = ZYDIS_BROADCAST_MODE_1_TO_8;
        break;
      case 2:
        ZVar53 = ZYDIS_BROADCAST_MODE_1_TO_16;
        uVar23 = 1;
        break;
      case 3:
        bVar54 = false;
        uVar23 = 2;
        break;
      case 4:
        bVar54 = false;
        uVar23 = 2;
        ZVar53 = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xae9,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      (instruction->avx).broadcast.mode = ZVar53;
      uVar9 = *(uint3 *)((long)puVar11 + 0xc);
    }
    bVar42 = (byte)(uVar9 >> 6);
    switch(uVar9 >> 6 & 0x1f) {
    case 0:
    case 1:
    case 2:
    case 3:
    case 8:
    case 9:
      goto switchD_00111a69_caseD_0;
    case 4:
    case 5:
    case 6:
    case 7:
      ZVar13 = '@';
      goto LAB_00111ce4;
    case 10:
    case 0xb:
    case 0xc:
    case 0x12:
      uVar44 = (ulong)(instruction->raw).field_3.vex.size;
      if (7 < uVar44) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb09,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_100;
      break;
    case 0xd:
    case 0x11:
    case 0x13:
    case 0x15:
      uVar44 = (ulong)(instruction->raw).field_3.vex.size;
      if (2 < uVar44) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb27,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar23 = uVar23 * 3;
      puVar34 = (undefined2 *)(ZydisSetAVXInformation_lookup_103 + uVar44);
      goto LAB_00111cdf;
    case 0xe:
    case 0xf:
    case 0x10:
    case 0x14:
      uVar44 = (ulong)(instruction->raw).field_3.vex.size;
      if (7 < uVar44) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb18,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_102;
      break;
    case 0x16:
    case 0x18:
      if (!bVar54) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb33,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      uVar44 = (ulong)(instruction->raw).field_3.vex.size;
      if (7 < uVar44) {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb34,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar33 = ZydisSetAVXInformation_lookup_104;
      break;
    case 0x17:
    case 0x19:
      if (!bVar54) {
        __assert_fail("index < 2",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb40,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((instruction->raw).field_3.vex.size != '\0') {
        __assert_fail("instruction->raw.mvex.SSS < (sizeof(lookup[index]) / sizeof((lookup[index])[0]))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb41,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      puVar34 = &ZydisSetAVXInformation_lookup_106;
LAB_00111cdf:
      pZVar35 = (ZyanU8 *)((long)puVar34 + uVar23);
      goto LAB_00111ce2;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xb46,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    pZVar35 = puVar33 + uVar44 + uVar23 * 8;
LAB_00111ce2:
    ZVar13 = *pZVar35;
LAB_00111ce4:
    local_b8->cd8_scale = ZVar13;
    bVar42 = (byte)(*(ushort *)((long)puVar11 + 0xc) >> 6);
switchD_00111a69_caseD_0:
    (local_b8->mvex).functionality = bVar42 & 0x1f;
    switch(*(ushort *)((long)puVar11 + 0xc) >> 6 & 0x1f) {
    case 0:
    case 1:
    case 4:
    case 5:
    case 6:
    case 7:
    case 0x13:
    case 0x15:
    case 0x17:
    case 0x19:
      break;
    case 2:
      bVar42 = (instruction->raw).field_3.vex.size;
      (instruction->avx).rounding.mode = (bVar42 & 3) + ZYDIS_ROUNDING_MODE_RN;
      goto LAB_0011232f;
    case 3:
      bVar42 = (instruction->raw).field_3.vex.size;
LAB_0011232f:
      if (3 < bVar42) {
        (instruction->avx).has_sae = '\x01';
      }
      break;
    case 8:
    case 9:
      (instruction->avx).swizzle.mode =
           (instruction->raw).field_3.vex.size + ZYDIS_SWIZZLE_MODE_DCBA;
      break;
    case 10:
    case 0xb:
    case 0xc:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      case '\x01':
switchD_00111d94_caseD_1:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_16;
        break;
      case '\x02':
switchD_00111d94_caseD_2:
        (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_16;
        break;
      case '\x03':
switchD_00111dfc_caseD_3:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_FLOAT16;
        break;
      case '\x04':
switchD_00111e29_caseD_4:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_REQUIRED_BITS;
        break;
      case '\x05':
switchD_00111e29_caseD_5:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT8;
        break;
      case '\x06':
switchD_00111e29_caseD_6:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_MAX_VALUE;
        break;
      case '\a':
switchD_00111e29_caseD_7:
        (instruction->avx).conversion.mode = ZYDIS_CONVERSION_MODE_SINT16;
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb7f,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      break;
    case 0xd:
    case 0x11:
      ZVar13 = (instruction->raw).field_3.vex.size;
      if (ZVar13 != '\0') {
        if (ZVar13 == '\x02') {
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_4_TO_8;
        }
        else {
          if (ZVar13 != '\x01') {
            __assert_fail("0",
                          "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                          ,0xbac,
                          "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                         );
          }
          (instruction->avx).broadcast.mode = ZYDIS_BROADCAST_MODE_1_TO_8;
        }
      }
      break;
    case 0xe:
    case 0xf:
    case 0x10:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      case '\x01':
        goto switchD_00111d94_caseD_1;
      case '\x02':
        goto switchD_00111d94_caseD_2;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xb9c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_00111e29_caseD_4;
      case '\x05':
        goto switchD_00111e29_caseD_5;
      case '\x06':
        goto switchD_00111e29_caseD_6;
      case '\a':
        goto switchD_00111e29_caseD_7;
      }
    case 0x12:
    case 0x16:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xbc5,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x03':
        goto switchD_00111dfc_caseD_3;
      case '\x04':
        goto switchD_00111e29_caseD_4;
      case '\x05':
        goto switchD_00111e29_caseD_5;
      case '\x06':
        goto switchD_00111e29_caseD_6;
      case '\a':
        goto switchD_00111e29_caseD_7;
      }
    case 0x14:
    case 0x18:
      switch((instruction->raw).field_3.vex.size) {
      case '\0':
        break;
      default:
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xbde,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      case '\x04':
        goto switchD_00111e29_caseD_4;
      case '\x05':
        goto switchD_00111e29_caseD_5;
      case '\x06':
        goto switchD_00111e29_caseD_6;
      case '\a':
        goto switchD_00111e29_caseD_7;
      }
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xbe5,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (((instruction->raw).modrm.mod != '\x03') && ((instruction->raw).field_3.xop.offset != '\0'))
    {
      (instruction->avx).has_eviction_hint = '\x01';
    }
    (instruction->avx).mask.mode = ZYDIS_MASK_MODE_MERGING;
    (instruction->avx).mask.reg = (instruction->raw).field_3.evex.b + ZYDIS_REGISTER_K0;
  default:
    goto switchD_001115a8_default;
  }
  bVar36 = bVar25 >> 5;
  bVar30 = *(byte *)((long)&ZydisSetAVXInformation_element_sizes + (ulong)bVar36);
  (local_b8->evex).element_size = bVar30;
  bVar26 = *(byte *)((long)puVar11 + 0xd);
  switch(bVar26 & 0x1f) {
  case 1:
    uVar44 = (ulong)(instruction->raw).field_3.evex.b;
    if (1 < uVar44) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x959,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (uVar44 != 0) {
      bVar54 = (bVar25 & 0xc0) != 0x40;
      if ((local_b8->vector_unified).W != '\0') {
        bVar54 = bVar36 != 4;
      }
      if (bVar54) {
        __assert_fail("!evex_b || ((!context->vector_unified.W && (context->evex.element_size == 16 || context->evex.element_size == 32)) || ( context->vector_unified.W && context->evex.element_size == 64))"
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x95c,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if ((*(ushort *)((long)puVar11 + 0xe) & 3) != 1) {
        __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x95d,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    if (bVar36 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x993,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar40 = (ulong)(bVar30 >> 5);
    local_b8->cd8_scale = ZydisSetAVXInformation_scales[uVar23 + uVar40 * 3 + uVar44 * 9];
    puVar33 = ZydisSetAVXInformation_broadcasts_73 + uVar44 * 0x24;
    goto LAB_001120f9;
  case 2:
    uVar44 = (ulong)(instruction->raw).field_3.evex.b;
    if (1 < uVar44) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x99c,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x99d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((bVar25 & 0xc0) != 0x40) {
      __assert_fail("(context->evex.element_size == 16) || (context->evex.element_size == 32)",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x99f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar44 != 0) && ((*(ushort *)((long)puVar11 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x9a0,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar36 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x9ca,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    uVar40 = (ulong)(bVar30 >> 5);
    local_b8->cd8_scale = ZydisSetAVXInformation_scales_77[uVar23 + uVar40 * 3 + uVar44 * 6];
    puVar33 = ZydisSetAVXInformation_broadcasts_78 + uVar44 * 0x18;
LAB_001120f9:
    ZVar53 = *(ZydisBroadcastMode *)(puVar33 + uVar23 * 4 + uVar40 * 0xc);
LAB_0011230e:
    (instruction->avx).broadcast.mode = ZVar53;
    goto LAB_0011243a;
  case 3:
    puVar41 = &ZydisSetAVXInformation_scales_79;
    break;
  case 4:
    goto switchD_0011168f_caseD_4;
  case 5:
    if (bVar36 == 5) {
      __assert_fail("size_index < 3",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0x9ff,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    ZVar13 = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_90 + (ulong)(bVar30 >> 5));
    goto LAB_001123e9;
  case 6:
    if (bVar36 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa05,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("context->vector_unified.W == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa06,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
  case 0xe:
switchD_0011168f_caseD_e:
    local_b8->cd8_scale = '\x10';
    goto LAB_0011243a;
  case 7:
    ZVar13 = (local_b8->vector_unified).W;
    if (ZVar13 == '\x01') {
      if (bVar36 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x9e0,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    else {
      if (ZVar13 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x9e3,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar36 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0x9dd,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
    }
    goto switchD_0011168f_caseD_4;
  case 8:
    ZVar13 = (local_b8->vector_unified).W;
    if (ZVar13 != '\x01') {
      if (ZVar13 != '\0') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa17,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar36 != 3) {
        __assert_fail("context->evex.element_size == 32",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa0d,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      local_b8->cd8_scale = '\b';
      goto LAB_0011243a;
    }
    if (bVar36 != 4) {
      __assert_fail("context->evex.element_size == 64",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa11,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar17 != 0x100) && (ZVar17 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa13,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_0011168f_caseD_e;
  case 9:
    ZVar13 = (local_b8->vector_unified).W;
    if (ZVar13 == '\x01') {
      if (bVar36 != 4) {
        __assert_fail("context->evex.element_size == 64",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa24,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      if (bVar43 != 2) {
        __assert_fail("instruction->avx.vector_length == 512",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                      ,0xa25,
                      "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                     );
      }
      goto LAB_00112431;
    }
    if (ZVar13 != '\0') {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa29,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar36 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa1e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((ZVar17 != 0x100) && (ZVar17 != 0x200)) {
      __assert_fail("(instruction->avx.vector_length == 256) || (instruction->avx.vector_length == 512)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa20,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    goto switchD_0011168f_caseD_e;
  case 10:
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa2d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar43 != 2) {
      __assert_fail("instruction->avx.vector_length == 512",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa2e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar36 != 3) {
      __assert_fail("context->evex.element_size == 32",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa2f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
LAB_00112431:
    local_b8->cd8_scale = ' ';
    goto LAB_0011243a;
  case 0xb:
    puVar41 = &ZydisSetAVXInformation_scales_88;
    break;
  case 0xc:
    puVar41 = &ZydisSetAVXInformation_scales_89;
    break;
  case 0xd:
    puVar41 = &ZydisSetAVXInformation_scales_90;
    break;
  case 0xf:
    puVar41 = &ZydisSetAVXInformation_scales_91;
    break;
  case 0x10:
    uVar44 = (ulong)(instruction->raw).field_3.evex.b;
    if (1 < uVar44) {
      __assert_fail("evex_b < 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5c,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((local_b8->vector_unified).W != '\0') {
      __assert_fail("!context->vector_unified.W",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5d,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if (bVar36 != 2) {
      __assert_fail("context->evex.element_size == 16",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5e,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    if ((uVar44 != 0) && ((*(ushort *)((long)puVar11 + 0xe) & 3) != 1)) {
      __assert_fail("!evex_b || def->functionality == ZYDIS_EVEX_FUNC_BC",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa5f,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    local_b8->cd8_scale = *(ZyanU8 *)((long)&ZydisSetAVXInformation_scales_93 + uVar23 + uVar44 * 3)
    ;
    ZVar53 = *(ZydisBroadcastMode *)
              (ZydisSetAVXInformation_broadcasts_94 + uVar23 * 4 + uVar44 * 0xc);
    goto LAB_0011230e;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xa7a,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar13 = *(ZyanU8 *)(uVar23 + (long)puVar41);
LAB_001123e9:
  local_b8->cd8_scale = ZVar13;
LAB_0011243a:
  if ((*(ushort *)((long)puVar11 + 0xe) & 0x780) != 0) {
    if ((instruction->avx).broadcast.mode != ZYDIS_BROADCAST_MODE_INVALID) {
      __assert_fail("!instruction->avx.broadcast.mode",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa84,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.is_static = '\x01';
    uVar37 = *(ushort *)((long)puVar11 + 0xe) >> 7 & 0xf;
    if (0xc < (ushort)uVar37) {
      __assert_fail("def->broadcast < (sizeof(broadcasts) / sizeof((broadcasts)[0]))",
                    "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                    ,0xa96,
                    "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                   );
    }
    (instruction->avx).broadcast.mode =
         *(ZydisBroadcastMode *)(ZydisSetAVXInformation_broadcasts_97 + (ulong)uVar37 * 4);
  }
  if (((instruction->raw).field_3.evex.b != '\0') &&
     (uVar15 = *(ushort *)((long)puVar11 + 0xe) & 3, 1 < uVar15)) {
    if (uVar15 != 3) {
      (instruction->avx).rounding.mode = bVar42 + ZYDIS_ROUNDING_MODE_RN;
    }
    (instruction->avx).has_sae = '\x01';
  }
  bVar42 = (instruction->raw).field_3.evex.aaa;
  (instruction->avx).mask.reg = bVar42 + ZYDIS_REGISTER_K0;
  switch(*(ushort *)((long)puVar11 + 0xe) >> 5 & 3) {
  case 0:
    iVar12 = 2;
    break;
  case 1:
    ZVar28 = ZYDIS_MASK_MODE_REQUIRED_BITS;
    goto LAB_001124d5;
  case 2:
    iVar12 = 4;
    break;
  case 3:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/Decoder.c"
                  ,0xabc,
                  "void ZydisSetAVXInformation(ZydisDecoderContext *, ZydisDecodedInstruction *, const ZydisInstructionDefinition *)"
                 );
  }
  ZVar28 = (uint)(instruction->raw).field_3.xop.offset + iVar12;
LAB_001124d5:
  ZVar32 = ZYDIS_MASK_MODE_DISABLED;
  if (bVar42 != 0) {
    ZVar32 = ZVar28;
  }
  (instruction->avx).mask.mode = ZVar32;
switchD_001115a8_default:
  ZVar14 = ZydisGetAccessedFlags
                     ((ZydisInstructionDefinition *)
                      CONCAT44(uStack_ac,
                               CONCAT13(prefix_bytes[3],
                                        CONCAT12(prefix_bytes[2],
                                                 CONCAT11(prefix_bytes[1],prefix_bytes[0])))),
                      (ZydisDefinitionAccessedFlags **)&modrm_byte_2);
  if (ZVar14 != '\0') {
    pbVar1 = (byte *)((long)&instruction->attributes + 1);
    *pbVar1 = *pbVar1 | 2;
  }
  instruction->cpu_flags = (ZydisAccessedFlags *)CONCAT71(uStack_57,modrm_byte_2);
  instruction->fpu_flags = (ZydisAccessedFlags *)CONCAT71(uStack_57,modrm_byte_2) + 1;
  return 0x100000;
}

Assistant:

static ZyanStatus ZydisDecodeInstruction(ZydisDecoderState* state,
    ZydisDecodedInstruction* instruction)
{
    ZYAN_ASSERT(state);
    ZYAN_ASSERT(instruction);

    // Iterate through the decoder tree
    const ZydisDecoderTreeNode* node = ZydisDecoderTreeGetRootNode();
    const ZydisDecoderTreeNode* temp = ZYAN_NULL;
    ZydisDecoderTreeNodeType node_type;
    do
    {
        node_type = node->type;
        ZyanU16 index = 0;
        ZyanStatus status = 0;
        switch (node_type)
        {
        case ZYDIS_NODETYPE_INVALID:
            if (temp)
            {
                node = temp;
                temp = ZYAN_NULL;
                node_type = ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX;
                if (state->prefixes.mandatory_candidate != 0x00)
                {
                    instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                        ZYDIS_PREFIX_TYPE_IGNORED;
                }
                if (state->prefixes.mandatory_candidate == 0x66)
                {
                    if (state->prefixes.offset_osz_override ==
                        state->prefixes.offset_mandatory)
                    {
                        instruction->raw.prefixes[state->prefixes.offset_mandatory].type =
                            ZYDIS_PREFIX_TYPE_EFFECTIVE;
                    }
                    instruction->attributes |= ZYDIS_ATTRIB_HAS_OPERANDSIZE;
                }
                continue;
            }
            return ZYDIS_STATUS_DECODING_ERROR;
        case ZYDIS_NODETYPE_FILTER_XOP:
            status = ZydisNodeHandlerXOP(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VEX:
            status = ZydisNodeHandlerVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_EMVEX:
            status = ZydisNodeHandlerEMVEX(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_OPCODE:
            status = ZydisNodeHandlerOpcode(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE:
            status = ZydisNodeHandlerMode(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_COMPACT:
            status = ZydisNodeHandlerModeCompact(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD:
            status = ZydisNodeHandlerModrmMod(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT:
            status = ZydisNodeHandlerModrmModCompact(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_REG:
            status = ZydisNodeHandlerModrmReg(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_MODRM_RM:
            status = ZydisNodeHandlerModrmRm(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_PREFIX_GROUP1:
            index = state->prefixes.group1 ? 1 : 0;
            break;
        case ZYDIS_NODETYPE_FILTER_MANDATORY_PREFIX:
            status = ZydisNodeHandlerMandatoryPrefix(state, instruction, &index);
            temp = ZydisDecoderTreeGetChildNode(node, 0);
            // TODO: Return to this point, if index == 0 contains a value and the previous path
            // TODO: was not successful
            // TODO: Restore consumed prefix
            break;
        case ZYDIS_NODETYPE_FILTER_OPERAND_SIZE:
            status = ZydisNodeHandlerOperandSize(state, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_ADDRESS_SIZE:
            status = ZydisNodeHandlerAddressSize(instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_VECTOR_LENGTH:
            status = ZydisNodeHandlerVectorLength(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_W:
            status = ZydisNodeHandlerRexW(state->context, instruction, &index);
            break;
        case ZYDIS_NODETYPE_FILTER_REX_B:
            status = ZydisNodeHandlerRexB(state->context, instruction, &index);
            break;
#ifndef ZYDIS_DISABLE_AVX512
        case ZYDIS_NODETYPE_FILTER_EVEX_B:
            status = ZydisNodeHandlerEvexB(instruction, &index);
            break;
#endif
#ifndef ZYDIS_DISABLE_KNC
        case ZYDIS_NODETYPE_FILTER_MVEX_E:
            status = ZydisNodeHandlerMvexE(instruction, &index);
            break;
#endif
        case ZYDIS_NODETYPE_FILTER_MODE_AMD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_AMD_BRANCHES));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_KNC:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_KNC));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_MPX:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MPX));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CET:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CET));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_LZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_LZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_TZCNT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_TZCNT));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_WBNOINVD:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_WBNOINVD));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_CLDEMOTE:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_CLDEMOTE));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_IPREFETCH:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_IPREFETCH));
            break;
        case ZYDIS_NODETYPE_FILTER_MODE_UD0_COMPAT:
            index = !!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_UD0_COMPAT));
            break;
        default:
            if (node_type & ZYDIS_NODETYPE_DEFINITION_MASK)
            {
                const ZydisInstructionDefinition* definition;
                ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                ZydisSetEffectiveOperandWidth(state->context, instruction, definition);
                ZydisSetEffectiveAddressWidth(state->context, instruction, definition);

                const ZydisInstructionEncodingInfo* info;
                ZydisGetInstructionEncodingInfo(node, &info);
                ZYAN_CHECK(ZydisDecodeOptionalInstructionParts(state, instruction, info));
                ZYAN_CHECK(ZydisCheckErrorConditions(state, instruction, definition));

                if (instruction->encoding == ZYDIS_INSTRUCTION_ENCODING_3DNOW)
                {
                    // Get actual 3DNOW opcode and definition
                    ZYAN_CHECK(ZydisInputNext(state, instruction, &instruction->opcode));
                    node = ZydisDecoderTreeGetRootNode();
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, 0x0F);
                    node = ZydisDecoderTreeGetChildNode(node, instruction->opcode);
                    if (node->type == ZYDIS_NODETYPE_INVALID)
                    {
                        return ZYDIS_STATUS_DECODING_ERROR;
                    }
                    ZYAN_ASSERT(node->type == ZYDIS_NODETYPE_FILTER_MODRM_MOD_COMPACT);
                    node = ZydisDecoderTreeGetChildNode(
                        node, (instruction->raw.modrm.mod == 0x3) ? 0 : 1);
                    ZYAN_ASSERT(node->type & ZYDIS_NODETYPE_DEFINITION_MASK);
                    ZydisGetInstructionDefinition(instruction->encoding, node->value, &definition);
                }

                instruction->mnemonic = definition->mnemonic;

#ifndef ZYDIS_MINIMAL_MODE

                instruction->operand_count = definition->operand_count;
                instruction->operand_count_visible = definition->operand_count_visible;
                state->context->definition = definition;

                instruction->meta.category = definition->category;
                instruction->meta.isa_set = definition->isa_set;
                instruction->meta.isa_ext = definition->isa_ext;
                instruction->meta.branch_type = definition->branch_type;
                ZYAN_ASSERT((instruction->meta.branch_type == ZYDIS_BRANCH_TYPE_NONE) ||
                        ((instruction->meta.category == ZYDIS_CATEGORY_CALL) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_COND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_UNCOND_BR) ||
                         (instruction->meta.category == ZYDIS_CATEGORY_RET)));
                instruction->meta.exception_class = definition->exception_class;

                if (!(state->decoder->decoder_mode & (1 << ZYDIS_DECODER_MODE_MINIMAL)))
                {
                    ZydisSetAttributes(state, instruction, definition);
                    switch (instruction->encoding)
                    {
                    case ZYDIS_INSTRUCTION_ENCODING_XOP:
                    case ZYDIS_INSTRUCTION_ENCODING_VEX:
                    case ZYDIS_INSTRUCTION_ENCODING_EVEX:
                    case ZYDIS_INSTRUCTION_ENCODING_MVEX:
                        ZydisSetAVXInformation(state->context, instruction, definition);
                        break;
                    default:
                        break;
                    }

                    const ZydisDefinitionAccessedFlags* flags;
                    if (ZydisGetAccessedFlags(definition, &flags))
                    {
                        instruction->attributes |= ZYDIS_ATTRIB_CPUFLAG_ACCESS;
                    }
                    instruction->cpu_flags = &flags->cpu_flags;
                    instruction->fpu_flags = &flags->fpu_flags;
                }

#endif

                return ZYAN_STATUS_SUCCESS;
            }
            ZYAN_UNREACHABLE;
        }
        ZYAN_CHECK(status);
        node = ZydisDecoderTreeGetChildNode(node, index);
    } while ((node_type != ZYDIS_NODETYPE_INVALID) && !(node_type & ZYDIS_NODETYPE_DEFINITION_MASK));
    return ZYAN_STATUS_SUCCESS;
}